

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

EAttrib strToEAttrib(CStr str)

{
  bool bVar1;
  EAttrib EVar2;
  CStrT<char> local_10;
  
  bVar1 = tl::CStrT<char>::operator==(&local_10,"POSITION");
  if (bVar1) {
    EVar2 = POSITION;
  }
  else {
    bVar1 = tl::CStrT<char>::operator==(&local_10,"NORMAL");
    EVar2 = NORMAL;
    if (!bVar1) {
      bVar1 = tl::CStrT<char>::operator==(&local_10,"TANGENT");
      EVar2 = TANGENT;
      if (!bVar1) {
        bVar1 = tl::CStrT<char>::operator==(&local_10,"TEXCOORD_0");
        EVar2 = TEXCOORD_0;
        if (!bVar1) {
          bVar1 = tl::CStrT<char>::operator==(&local_10,"TEXCOORD_1");
          EVar2 = TEXCOORD_1;
          if (!bVar1) {
            bVar1 = tl::CStrT<char>::operator==(&local_10,"COLOR_0");
            EVar2 = COLOR;
            if (!bVar1) {
              bVar1 = tl::CStrT<char>::operator==(&local_10,"JOINTS_0");
              EVar2 = JOINTS;
              if (!bVar1) {
                bVar1 = tl::CStrT<char>::operator==(&local_10,"WEIGHTS_0");
                EVar2 = bVar1 ^ COUNT;
              }
            }
          }
        }
      }
    }
  }
  return EVar2;
}

Assistant:

EAttrib strToEAttrib(CStr str)
{
    if(str == "POSITION") return EAttrib::POSITION;
    if(str == "NORMAL") return EAttrib::NORMAL;
    if(str == "TANGENT") return EAttrib::TANGENT;
    //if(str == "COTANGENT") return EAttrib::COTANGENT; // this one is not the gltf spec
    if(str == "TEXCOORD_0") return EAttrib::TEXCOORD_0;
    if(str == "TEXCOORD_1") return EAttrib::TEXCOORD_1;
    if(str == "COLOR_0") return EAttrib::COLOR;
    if(str == "JOINTS_0") return EAttrib::JOINTS;
    if(str == "WEIGHTS_0") return EAttrib::WEIGHTS;
    return EAttrib::COUNT;
}